

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

bool __thiscall
flatbuffers::rust::RustGenerator::GenerateSymbols<flatbuffers::EnumDef>
          (RustGenerator *this,SymbolTable<flatbuffers::EnumDef> *symbols,
          function<void_(const_flatbuffers::EnumDef_&)> *gen_symbol)

{
  string *__return_storage_ptr__;
  bool bVar1;
  reference ppEVar2;
  char *pcVar3;
  string local_300;
  undefined1 local_2d9;
  undefined1 local_2d8 [7];
  bool save_success;
  undefined1 local_2b8 [8];
  string file_path;
  string directories;
  string local_270;
  allocator<char> local_249;
  string local_248;
  allocator<char> local_221;
  string local_220;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  allocator<char> local_131;
  string local_130;
  allocator<char> local_109;
  string local_108;
  allocator<char> local_e1;
  string local_e0;
  allocator<char> local_b9;
  string local_b8;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  EnumDef *local_40;
  EnumDef *symbol;
  __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
  local_30;
  const_iterator it;
  function<void_(const_flatbuffers::EnumDef_&)> *gen_symbol_local;
  SymbolTable<flatbuffers::EnumDef> *symbols_local;
  RustGenerator *this_local;
  
  it._M_current = (EnumDef **)gen_symbol;
  local_30._M_current =
       (EnumDef **)
       std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::begin
                 (&symbols->vec);
  while( true ) {
    symbol = (EnumDef *)
             std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>::end
                       (&symbols->vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_30,
                       (__normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
                        *)&symbol);
    if (!bVar1) break;
    ppEVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
              ::operator*(&local_30);
    local_40 = *ppEVar2;
    if (((local_40->super_Definition).generated & 1U) == 0) {
      CodeWriter::Clear(&this->code_);
      pcVar3 = BaseGenerator::FlatBuffersGeneratedWarning();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,pcVar3,&local_81);
      std::operator+(&local_60,"// ",&local_80);
      CodeWriter::operator+=(&this->code_,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"// @generated",&local_b9);
      CodeWriter::operator+=(&this->code_,&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e0,"extern crate alloc;",&local_e1);
      CodeWriter::operator+=(&this->code_,&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::allocator<char>::~allocator(&local_e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_108,"extern crate flatbuffers;",&local_109);
      CodeWriter::operator+=(&this->code_,&local_108);
      std::__cxx11::string::~string((string *)&local_108);
      std::allocator<char>::~allocator(&local_109);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"use alloc::boxed::Box;",&local_131);
      CodeWriter::operator+=(&this->code_,&local_130);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_131);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"use alloc::string::{String, ToString};",&local_159);
      CodeWriter::operator+=(&this->code_,&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"use alloc::vec::Vec;",&local_181);
      CodeWriter::operator+=(&this->code_,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator(&local_181);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,"use core::mem;",&local_1a9);
      CodeWriter::operator+=(&this->code_,&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"use core::cmp::Ordering;",&local_1d1);
      CodeWriter::operator+=(&this->code_,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::allocator<char>::~allocator(&local_1d1);
      if (((((this->super_BaseGenerator).parser_)->opts).rust_serialize & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,"extern crate serde;",&local_1f9);
        CodeWriter::operator+=(&this->code_,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator(&local_1f9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_220,
                   "use self::serde::ser::{Serialize, Serializer, SerializeStruct};",&local_221);
        CodeWriter::operator+=(&this->code_,&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::allocator<char>::~allocator(&local_221);
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_248,"use self::flatbuffers::{EndianScalar, Follow};",&local_249);
      CodeWriter::operator+=(&this->code_,&local_248);
      std::__cxx11::string::~string((string *)&local_248);
      std::allocator<char>::~allocator(&local_249);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,"use super::*;",
                 (allocator<char> *)(directories.field_2._M_local_buf + 0xf));
      CodeWriter::operator+=(&this->code_,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      std::allocator<char>::~allocator((allocator<char> *)(directories.field_2._M_local_buf + 0xf));
      this->cur_name_space_ = (local_40->super_Definition).defined_namespace;
      std::function<void_(const_flatbuffers::EnumDef_&)>::operator()(gen_symbol,local_40);
      __return_storage_ptr__ = (string *)((long)&file_path.field_2 + 8);
      IdlNamer::Directories_abi_cxx11_
                (__return_storage_ptr__,&this->namer_,(local_40->super_Definition).defined_namespace
                 ,None,kUpperCamel);
      EnsureDirExists(__return_storage_ptr__);
      Namer::File<flatbuffers::EnumDef>
                ((string *)local_2d8,&(this->namer_).super_Namer,local_40,None);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&file_path.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8)
      ;
      std::__cxx11::string::~string((string *)local_2d8);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      CodeWriter::ToString_abi_cxx11_(&local_300,&this->code_);
      bVar1 = SaveFile(pcVar3,&local_300,false);
      std::__cxx11::string::~string((string *)&local_300);
      if (!bVar1) {
        this_local._7_1_ = 0;
      }
      local_2d9 = bVar1;
      std::__cxx11::string::~string((string *)local_2b8);
      std::__cxx11::string::~string((string *)(file_path.field_2._M_local_buf + 8));
      if (!bVar1) goto LAB_0034b177;
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::EnumDef_*const_*,_std::vector<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>_>
    ::operator++(&local_30,0);
  }
  this_local._7_1_ = 1;
LAB_0034b177:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool GenerateSymbols(const SymbolTable<T> &symbols,
                       std::function<void(const T &)> gen_symbol) {
    for (auto it = symbols.vec.begin(); it != symbols.vec.end(); it++) {
      const T &symbol = **it;
      if (symbol.generated) continue;
      code_.Clear();
      code_ += "// " + std::string(FlatBuffersGeneratedWarning());
      code_ += "// @generated";
      code_ += "extern crate alloc;";
      code_ += "extern crate flatbuffers;";
      code_ += "use alloc::boxed::Box;";
      code_ += "use alloc::string::{String, ToString};";
      code_ += "use alloc::vec::Vec;";
      code_ += "use core::mem;";
      code_ += "use core::cmp::Ordering;";
      if (parser_.opts.rust_serialize) {
        code_ += "extern crate serde;";
        code_ +=
            "use self::serde::ser::{Serialize, Serializer, SerializeStruct};";
      }
      code_ += "use self::flatbuffers::{EndianScalar, Follow};";
      code_ += "use super::*;";
      cur_name_space_ = symbol.defined_namespace;
      gen_symbol(symbol);

      const std::string directories =
          namer_.Directories(*symbol.defined_namespace);
      EnsureDirExists(directories);
      const std::string file_path = directories + namer_.File(symbol);
      const bool save_success =
          SaveFile(file_path.c_str(), code_.ToString(), /*binary=*/false);
      if (!save_success) return false;
    }
    return true;
  }